

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cpp
# Opt level: O1

shared_ptr<index_tree> __thiscall dfa::get_index_tree(dfa *this,wchar_t key)

{
  ulong uVar1;
  long *plVar2;
  size_type sVar3;
  long lVar4;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined4 in_register_00000034;
  long *plVar7;
  long *plVar8;
  shared_ptr<index_tree> sVar9;
  
  uVar1 = ((long *)CONCAT44(in_register_00000034,key))[1];
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(long)in_EDX % uVar1);
  plVar7 = *(long **)(*(long *)CONCAT44(in_register_00000034,key) + (long)p_Var5 * 8);
  _Var6._M_pi = p_Var5;
  plVar8 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar2 = (long *)*plVar7, plVar8 = plVar7, *(int *)((long *)*plVar7 + 1) != in_EDX)) {
    while (plVar7 = plVar2, plVar2 = (long *)*plVar7, plVar2 != (long *)0x0) {
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((ulong)(long)(int)plVar2[1] % uVar1);
      plVar8 = (long *)0x0;
      if ((_Var6._M_pi != p_Var5) || (plVar8 = plVar7, (int)plVar2[1] == in_EDX)) goto LAB_00106576;
    }
    plVar8 = (long *)0x0;
  }
LAB_00106576:
  if (plVar8 == (long *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *plVar8;
  }
  if (lVar4 == 0) {
    (this->index_trees_)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->index_trees_)._M_h._M_bucket_count = 0;
  }
  else {
    (this->index_trees_)._M_h._M_buckets = *(__buckets_ptr *)(lVar4 + 0x10);
    sVar3 = *(size_type *)(lVar4 + 0x18);
    (this->index_trees_)._M_h._M_bucket_count = sVar3;
    if (sVar3 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
      }
    }
  }
  sVar9.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar9.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<index_tree>)sVar9.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<index_tree> dfa::get_index_tree(wchar_t key)
{
    auto iter = index_trees_.find(key);
    if (iter != index_trees_.end())
    {
        return iter->second;
    }
    return nullptr;
}